

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACS.cpp
# Opt level: O0

void __thiscall
imrt::ACS::ACS(ACS *this,vector<double,_std::allocator<double>_> *w,
              vector<double,_std::allocator<double>_> *Zmin,
              vector<double,_std::allocator<double>_> *Zmax,Collimator *_collimator,
              vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int max_apertures,
              int max_intensity,int initial_intensity,int step_intensity,int _n_ants,
              double _initial_pheromone,double _alpha,double _beta,double _rho)

{
  long *in_RDI;
  undefined4 in_stack_00000020;
  double in_stack_00000078;
  double in_stack_00000080;
  double in_stack_00000088;
  double in_stack_00000090;
  int in_stack_000000e8;
  undefined4 in_stack_ffffffffffffff34;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ACO::ACO((ACO *)_collimator,(vector<double,_std::allocator<double>_> *)volumes,
           (vector<double,_std::allocator<double>_> *)_initial_pheromone,
           (vector<double,_std::allocator<double>_> *)_alpha,(Collimator *)_beta,
           (vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)_rho,(int)Zmin,(int)w,(int)this,
           in_stack_000000e8,max_apertures,in_stack_00000090,in_stack_00000088,in_stack_00000080,
           in_stack_00000078);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_00000020));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_00000020));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_00000020));
  *in_RDI = (long)&PTR__ACS_001a2b48;
  in_RDI[0x22] = 0x3fe0000000000000;
  (**(code **)(*in_RDI + 0x18))();
  return;
}

Assistant:

ACS::ACS(vector<double> w, vector<double> Zmin, vector<double> Zmax, Collimator& _collimator,
           vector<Volume>& volumes, int max_apertures, int max_intensity, int initial_intensity,
           int step_intensity, int _n_ants, double _initial_pheromone, double _alpha, double _beta, double _rho):
           ACO(w, Zmin, Zmax, _collimator, volumes, max_apertures, max_intensity, initial_intensity,
               step_intensity, _n_ants, _initial_pheromone, _alpha, _beta, _rho){
             q0=0.5;
             calculateProbability();
             //printProbability();
           }